

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O0

void __thiscall sqvector<char>::resize(sqvector<char> *this,SQUnsignedInteger newsize,char *fill)

{
  undefined1 *in_RDX;
  sqvector<char> *in_RSI;
  long *in_RDI;
  SQUnsignedInteger i;
  sqvector<char> *local_20;
  
  if ((sqvector<char> *)in_RDI[2] < in_RSI) {
    _realloc(in_RSI,(SQUnsignedInteger)in_RDX);
  }
  local_20 = in_RSI;
  if ((sqvector<char> *)in_RDI[1] < in_RSI) {
    while ((sqvector<char> *)in_RDI[1] < in_RSI) {
      *(undefined1 *)(*in_RDI + in_RDI[1]) = *in_RDX;
      in_RDI[1] = in_RDI[1] + 1;
    }
  }
  else {
    for (; local_20 < (sqvector<char> *)in_RDI[1];
        local_20 = (sqvector<char> *)((long)&local_20->_vals + 1)) {
    }
    in_RDI[1] = (long)in_RSI;
  }
  return;
}

Assistant:

void resize(SQUnsignedInteger newsize, const T& fill = T())
    {
        if(newsize > _allocated)
            _realloc(newsize);
        if(newsize > _size) {
            while(_size < newsize) {
                new ((void *)&_vals[_size]) T(fill);
                _size++;
            }
        }
        else{
            for(SQUnsignedInteger i = newsize; i < _size; i++) {
                _vals[i].~T();
            }
            _size = newsize;
        }
    }